

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

QWidget * __thiscall QMainWindowLayout::centralWidget(QMainWindowLayout *this)

{
  QWidget *pQVar1;
  
  if (*(long **)(this + 0x1c0) != (long *)0x0) {
    pQVar1 = (QWidget *)(**(code **)(**(long **)(this + 0x1c0) + 0x68))();
    return pQVar1;
  }
  return (QWidget *)0x0;
}

Assistant:

QWidget *QMainWindowLayoutState::centralWidget() const
{
    QLayoutItem *item = nullptr;

#if QT_CONFIG(dockwidget)
    item = dockAreaLayout.centralWidgetItem;
#else
    item = centralWidgetItem;
#endif

    if (item != nullptr)
        return item->widget();
    return nullptr;
}